

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadArray<long>
          (CrateReader *this,vector<long,_std::allocator<long>_> *d)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  ssize_t sVar4;
  int iVar5;
  char *pcVar6;
  uint64_t n;
  uint32_t _n;
  uint32_t shapesize;
  ostringstream ss_e;
  uint64_t local_1c0;
  uint local_1b8;
  uint32_t local_1b4 [9];
  ostringstream local_190 [376];
  
  if (d == (vector<long,_std::allocator<long>_> *)0x0) {
    return false;
  }
  local_1c0 = 0;
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar1 = StreamReader::read4(this->_sr,local_1b4);
    if (bVar1) {
      bVar1 = StreamReader::read4(this->_sr,&local_1b8);
      if (bVar1) {
        local_1c0 = (uint64_t)local_1b8;
        goto LAB_001a7e52;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_190);
      poVar2 = ::std::operator<<((ostream *)local_190,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      iVar5 = 0x63f;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_190);
      poVar2 = ::std::operator<<((ostream *)local_190,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      iVar5 = 0x63a;
    }
  }
  else {
    bVar1 = StreamReader::read8(this->_sr,&local_1c0);
    if (bVar1) {
LAB_001a7e52:
      if ((this->_config).maxArrayElements < local_1c0) {
        ::std::__cxx11::ostringstream::ostringstream(local_190);
        poVar2 = ::std::operator<<((ostream *)local_190,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadArray");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x64a);
        ::std::operator<<(poVar2," ");
        pcVar6 = "Too many array elements.";
      }
      else {
        if (local_1c0 == 0) {
          return true;
        }
        uVar3 = local_1c0 * 8 + this->_memoryUsage;
        this->_memoryUsage = uVar3;
        if (uVar3 <= (this->_config).maxMemoryBudget) {
          ::std::vector<long,_std::allocator<long>_>::resize(d,local_1c0);
          sVar4 = StreamReader::read(this->_sr,(int)(void *)(local_1c0 << 3),
                                     (void *)(local_1c0 << 3),
                                     (size_t)(d->super__Vector_base<long,_std::allocator<long>_>).
                                             _M_impl.super__Vector_impl_data._M_start);
          return sVar4 == 0;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_190);
        poVar2 = ::std::operator<<((ostream *)local_190,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadArray");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x651);
        ::std::operator<<(poVar2," ");
        pcVar6 = "Reached to max memory budget.";
      }
      goto LAB_001a810c;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = ::std::operator<<((ostream *)local_190,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadArray");
    poVar2 = ::std::operator<<(poVar2,"():");
    iVar5 = 0x644;
  }
  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,iVar5);
  ::std::operator<<(poVar2," ");
  pcVar6 = "Failed to read the number of array elements.";
LAB_001a810c:
  poVar2 = ::std::operator<<((ostream *)local_190,pcVar6);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream(local_190);
  return false;
}

Assistant:

bool CrateReader::ReadArray(std::vector<T> *d) {

  if (!d) {
    return false;
  }

  uint64_t n{0};
  if (VERSION_LESS_THAN_0_8_0(_version)) {
    uint32_t shapesize; // not used
    if (!_sr->read4(&shapesize)) {
      PUSH_ERROR("Failed to read the number of array elements.");
      return false;
    }
    uint32_t _n;
    if (!_sr->read4(&_n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    n = _n;
  } else {
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }
  }

  if (n > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  if (n == 0) {
    return true;
  }

  CHECK_MEMORY_USAGE(sizeof(T) * size_t(n));

  d->resize(size_t(n));
  if (_sr->read(sizeof(T) * n, sizeof(T) * size_t(n), reinterpret_cast<uint8_t *>(d->data()))) {
    return false;
  }

  return true;
}